

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O2

int __thiscall
andyzip::brotli_decoder::transform_dictionary_word
          (brotli_decoder *this,char *buffer,uint8_t *src,int transform_idx,int copy_len,
          int ringbuffer_mask)

{
  byte bVar1;
  byte bVar2;
  int i;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint8_t *puVar10;
  char *psrc;
  char *pcVar11;
  uint8_t fermented [24];
  
  lVar4 = (long)transform_idx * 0x10;
  for (lVar8 = 0; (&brotli_data::table)[lVar8 + lVar4] != '\0'; lVar8 = lVar8 + 1) {
    buffer[lVar8] = (&brotli_data::table)[lVar8 + lVar4];
  }
  bVar1 = (&DAT_00127d96)[lVar4];
  puVar10 = src;
  if (bVar1 < 0xc) {
    if (bVar1 < 3) {
      if ((byte)(bVar1 - 1) < 2) {
        if (copy_len < 0x19) {
          memcpy(fermented,src,(long)copy_len);
        }
        iVar3 = 0;
        do {
          puVar10 = fermented;
          if (copy_len <= iVar3) break;
          lVar5 = (long)iVar3;
          bVar2 = src[lVar5];
          if (bVar2 < 0xc0) {
            iVar7 = 1;
            if ((byte)(bVar2 + 0x9f) < 0x1a) goto LAB_00106532;
          }
          else if (bVar2 < 0xe0) {
            iVar7 = 2;
            if (iVar3 + 1 < copy_len) {
              lVar5 = (long)(iVar3 + 1);
LAB_00106532:
              fermented[lVar5] = fermented[lVar5] ^ 0x20;
            }
          }
          else {
            iVar7 = 3;
            if (iVar3 + 2 < copy_len) {
              lVar5 = (long)(iVar3 + 2);
              goto LAB_00106532;
            }
          }
          iVar3 = iVar3 + iVar7;
          puVar10 = fermented;
        } while (bVar1 != 1);
      }
    }
    else {
      uVar9 = bVar1 - 2;
      copy_len = copy_len - uVar9;
      puVar10 = src + uVar9;
    }
  }
  else {
    copy_len = (copy_len - (uint)bVar1) + 0xb;
  }
  lVar5 = -lVar8;
  for (lVar6 = 0; copy_len != (int)lVar6; lVar6 = lVar6 + 1) {
    buffer[lVar8 + lVar6] = puVar10[lVar6];
    lVar5 = lVar5 + -1;
  }
  lVar5 = -lVar5;
  for (pcVar11 = &DAT_00127d97 + lVar4; *pcVar11 != '\0'; pcVar11 = pcVar11 + 1) {
    buffer[lVar5] = *pcVar11;
    lVar5 = lVar5 + 1;
  }
  return (int)lVar5;
}

Assistant:

int transform_dictionary_word(char *buffer, const uint8_t *src, int transform_idx, int copy_len, int ringbuffer_mask) {
      char *dest = buffer;
      auto &t = brotli_data::table[transform_idx];
      for (const char *psrc = t.prefix; *psrc; ++psrc) {
        *dest++ = *psrc;
      }

      if (t.id >= brotli_data::OmitLast1) {
        copy_len -= t.id - brotli_data::OmitLast1 + 1;
      } else if (t.id >= brotli_data::OmitFirst1) {
        copy_len -= t.id - brotli_data::OmitFirst1 + 1;
        src += t.id - brotli_data::OmitFirst1 + 1;
      }

      // fermentation (aka. case conversion)
      if (t.id == brotli_data::FermentFirst || t.id == brotli_data::FermentAll) {
        uint8_t fermented[24];
        if (copy_len <= 24) {
          memcpy(fermented, src, copy_len);
        }
  
        for (int i = 0; i < copy_len;) {
          uint8_t chr = src[i];
          if (chr < 192) {
            if (chr >= 97 && chr <= 122) {
              fermented[i] ^= 32;
            }
            ++i;
          } else if (chr < 224) {
            if (i + 1 < copy_len) {
              fermented[i+1] ^= 32;
            }
            i += 2;
          } else {
            if (i + 2 < copy_len) {
              fermented[i+2] ^= 32;
            }
            i += 3;
          }
          if (t.id == brotli_data::FermentFirst) break;
        }
        src = fermented;
      }

      for (int i = 0; i != copy_len; ++i) {
        *dest++ = *src++;
      }

      for (const char *dsrc = t.suffix; *dsrc; ++dsrc) {
        *dest++ = *dsrc;
      }

      return (int)(dest - buffer);
    }